

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::SimpleFilteredSentenceBreakIterator
          (SimpleFilteredSentenceBreakIterator *this,BreakIterator *adopt,UCharsTrie *forwards,
          UCharsTrie *backwards,UErrorCode *status)

{
  SimpleFilteredSentenceBreakData *this_00;
  Locale *valid;
  SimpleFilteredSentenceBreakData *local_220;
  Locale local_1f0;
  Locale local_110;
  UErrorCode *local_30;
  UErrorCode *status_local;
  UCharsTrie *backwards_local;
  UCharsTrie *forwards_local;
  BreakIterator *adopt_local;
  SimpleFilteredSentenceBreakIterator *this_local;
  
  local_30 = status;
  status_local = (UErrorCode *)backwards;
  backwards_local = forwards;
  forwards_local = (UCharsTrie *)adopt;
  adopt_local = &this->super_BreakIterator;
  BreakIterator::getLocale(&local_110,adopt,ULOC_VALID_LOCALE,status);
  BreakIterator::getLocale(&local_1f0,(BreakIterator *)forwards_local,ULOC_ACTUAL_LOCALE,local_30);
  valid = &local_110;
  BreakIterator::BreakIterator(&this->super_BreakIterator,valid,&local_1f0);
  Locale::~Locale(&local_1f0);
  Locale::~Locale(&local_110);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleFilteredSentenceBreakIterator_004e4668;
  this_00 = (SimpleFilteredSentenceBreakData *)UMemory::operator_new((UMemory *)0x20,(size_t)valid);
  local_220 = (SimpleFilteredSentenceBreakData *)0x0;
  if (this_00 != (SimpleFilteredSentenceBreakData *)0x0) {
    SimpleFilteredSentenceBreakData::SimpleFilteredSentenceBreakData
              (this_00,backwards_local,(UCharsTrie *)status_local);
    local_220 = this_00;
  }
  this->fData = local_220;
  LocalPointer<icu_63::BreakIterator>::LocalPointer
            (&this->fDelegate,(BreakIterator *)forwards_local);
  LocalUTextPointer::LocalUTextPointer(&this->fText,(UText *)0x0);
  return;
}

Assistant:

SimpleFilteredSentenceBreakIterator::SimpleFilteredSentenceBreakIterator(BreakIterator *adopt, UCharsTrie *forwards, UCharsTrie *backwards, UErrorCode &status) :
  BreakIterator(adopt->getLocale(ULOC_VALID_LOCALE,status),adopt->getLocale(ULOC_ACTUAL_LOCALE,status)),
  fData(new SimpleFilteredSentenceBreakData(forwards, backwards)),
  fDelegate(adopt)
{
  // all set..
}